

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

void TR_DecList(ast *node)

{
  ast *node_00;
  ast *in_RDI;
  ast *c3;
  ast *in_stack_00000120;
  
  node_00 = child(in_RDI,3);
  child(in_RDI,1);
  TR_Dec(in_stack_00000120);
  if (node_00 != (ast *)0x0) {
    TR_DecList(node_00);
  }
  return;
}

Assistant:

static void TR_DecList(ast *node) {
    ast *c3 = child(node, 3);
    TR_Dec(child(node, 1));
    if (c3) TR_DecList(c3);
}